

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteHeader(BinaryWriter *this,char *name,int index)

{
  bool bVar1;
  Stream *pSVar2;
  int index_local;
  char *name_local;
  BinaryWriter *this_local;
  
  bVar1 = Stream::has_log_stream(this->stream_);
  if (bVar1) {
    if (index == -1) {
      pSVar2 = Stream::log_stream(this->stream_);
      Stream::Writef(pSVar2,"; %s\n",name);
    }
    else {
      pSVar2 = Stream::log_stream(this->stream_);
      Stream::Writef(pSVar2,"; %s %d\n",name,(ulong)(uint)index);
    }
  }
  return;
}

Assistant:

void BinaryWriter::WriteHeader(const char* name, int index) {
  if (stream_->has_log_stream()) {
    if (index == PRINT_HEADER_NO_INDEX) {
      stream_->log_stream().Writef("; %s\n", name);
    } else {
      stream_->log_stream().Writef("; %s %d\n", name, index);
    }
  }
}